

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O0

float divide(float x,float y)

{
  ostream *poVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,in_XMM0_Da);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_XMM0_Da / in_XMM1_Da;
}

Assistant:

float
divide (float x, float y)
{
    std::cout << x << " / " << y << std::endl;
    return x / y;
}